

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

bool cvui::mouse(int theButton,int theQuery)

{
  bool bVar1;
  allocator<char> local_31;
  String local_30;
  int local_10;
  int local_c;
  int theQuery_local;
  int theButton_local;
  
  local_10 = theQuery;
  local_c = theButton;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  bVar1 = mouse(&local_30,local_c,local_10);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return bVar1;
}

Assistant:

bool mouse(int theButton, int theQuery) {
	return mouse("", theButton, theQuery);
}